

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O1

void __thiscall capnproto_test::capnp::test::TestMoreStuff::Server::dispatchCall(Server *this)

{
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> in_RCX;
  uint16_t in_DX;
  long *in_RSI;
  
  dispatchCall(this,(long)in_RSI + *(long *)(*in_RSI + -0x18),in_DX,in_RCX);
  return;
}

Assistant:

::capnp::Capability::Server::DispatchCallResult TestMoreStuff::Server::dispatchCall(
    uint64_t interfaceId, uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (interfaceId) {
    case 0xddc70bf9784133cfull:
      return dispatchCallInternal(methodId, context);
    case 0xa0e77035bdff0051ull:
      return  ::capnproto_test::capnp::test::TestCallOrder::Server::dispatchCallInternal(methodId, context);
    default:
      return internalUnimplemented("capnp/test.capnp:TestMoreStuff", interfaceId);
  }
}